

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O2

FT_Error pfr_extra_item_load_stem_snaps(FT_Byte *p,FT_Byte *limit,PFR_PhyFont phy_font)

{
  FT_Byte *pFVar1;
  uint in_EAX;
  FT_Int *pFVar2;
  FT_Error FVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uStack_38;
  FT_Error error;
  
  uStack_38 = (ulong)in_EAX;
  FVar3 = 0;
  if ((phy_font->vertical).stem_snaps == (FT_Int *)0x0) {
    pFVar1 = p + 1;
    FVar3 = 8;
    if (pFVar1 <= limit) {
      uVar6 = *p & 0xf;
      uVar5 = (*p >> 4) + uVar6;
      if (pFVar1 + (ulong)uVar5 * 2 <= limit) {
        pFVar2 = (FT_Int *)
                 ft_mem_realloc(phy_font->memory,4,0,(ulong)uVar5,(void *)0x0,
                                (FT_Error *)((long)&uStack_38 + 4));
        FVar3 = uStack_38._4_4_;
        if (uStack_38._4_4_ == 0) {
          (phy_font->vertical).stem_snaps = pFVar2;
          (phy_font->horizontal).stem_snaps = pFVar2 + uVar6;
          for (lVar4 = 0; (uint)lVar4 != uVar5; lVar4 = lVar4 + 1) {
            pFVar2[lVar4] = (int)(short)((ushort)pFVar1[lVar4 * 2] << 8) | (uint)p[lVar4 * 2 + 2];
          }
        }
      }
    }
  }
  return FVar3;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_extra_item_load_stem_snaps( FT_Byte*     p,
                                  FT_Byte*     limit,
                                  PFR_PhyFont  phy_font )
  {
    FT_UInt    count, num_vert, num_horz;
    FT_Int*    snaps  = NULL;
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = phy_font->memory;


    if ( phy_font->vertical.stem_snaps )
      goto Exit;

    PFR_CHECK( 1 );
    count = PFR_NEXT_BYTE( p );

    num_vert = count & 15;
    num_horz = count >> 4;
    count    = num_vert + num_horz;

    PFR_CHECK( count * 2 );

    if ( FT_NEW_ARRAY( snaps, count ) )
      goto Exit;

    phy_font->vertical.stem_snaps = snaps;
    phy_font->horizontal.stem_snaps = snaps + num_vert;

    for ( ; count > 0; count--, snaps++ )
      *snaps = FT_NEXT_SHORT( p );

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_extra_item_load_stem_snaps:"
               " invalid stem snaps table\n" ));
    goto Exit;
  }